

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMGBndry.cpp
# Opt level: O0

void amrex::MLMGBndry::setBoxBC
               (RealTuple *bloc,BCTuple *bctag,Box *bx,Box *domain,Array<LinOpBCType,_3> *lo,
               Array<LinOpBCType,_3> *hi,Real *dx,int ratio,RealVect *interior_bloc,
               Array<Real,_3> *domain_bloc_lo,Array<Real,_3> *domain_bloc_hi,
               GpuArray<int,_3U> *is_periodic)

{
  bool bVar1;
  int i;
  int iVar2;
  int iVar3;
  void *pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  Real *pRVar9;
  undefined8 in_RSI;
  array<double,_6UL> *in_RDI;
  Box *pBVar10;
  long in_stack_00000008;
  int in_stack_00000010;
  RealVect *in_stack_00000018;
  long in_stack_00000030;
  value_type linop_bc;
  int dir;
  Orientation face;
  OrientationIter fi;
  OrientationIter *in_stack_ffffffffffffff38;
  array<double,_6UL> *in_stack_ffffffffffffff40;
  Box *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  value_type local_84;
  value_type_conflict1 local_70;
  Orientation local_50;
  OrientationIter local_4c [9];
  undefined8 local_28;
  array<double,_6UL> *local_20;
  int local_14;
  long local_10;
  char *local_8;
  
  local_28 = in_RSI;
  local_20 = in_RDI;
  OrientationIter::OrientationIter(local_4c);
  while (pvVar4 = OrientationIter::operator_cast_to_void_(local_4c), pvVar4 != (void *)0x0) {
    local_50 = OrientationIter::operator()(in_stack_ffffffffffffff38);
    i = Orientation::coordDir(&local_50);
    iVar2 = Box::operator[](in_stack_ffffffffffffff50,(Orientation)(int)in_stack_ffffffffffffff58);
    iVar3 = Box::operator[](in_stack_ffffffffffffff50,(Orientation)(int)in_stack_ffffffffffffff58);
    if ((iVar2 == iVar3) &&
       (local_10 = in_stack_00000030, local_14 = i, *(int *)(in_stack_00000030 + (long)i * 4) == 0))
    {
      bVar1 = Orientation::isLow(&local_50);
      if (bVar1) {
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        local_70 = *pvVar5;
      }
      else {
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        local_70 = *pvVar5;
      }
      Orientation::operator_cast_to_int(&local_50);
      pvVar6 = std::array<double,_6UL>::operator[]
                         (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      *pvVar6 = local_70;
      bVar1 = Orientation::isLow(&local_50);
      if (bVar1) {
        pvVar7 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        local_84 = *pvVar7;
      }
      else {
        pvVar7 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        local_84 = *pvVar7;
      }
      if (local_84 == Dirichlet) {
        Orientation::operator_cast_to_int(&local_50);
        pvVar8 = std::array<amrex::BoundCond,_6UL>::operator[]
                           ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        BoundCond::operator=(pvVar8,0x65);
      }
      else if (local_84 == Neumann) {
        Orientation::operator_cast_to_int(&local_50);
        pvVar8 = std::array<amrex::BoundCond,_6UL>::operator[]
                           ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        BoundCond::operator=(pvVar8,0x66);
      }
      else if (local_84 == reflect_odd) {
        Orientation::operator_cast_to_int(&local_50);
        pvVar8 = std::array<amrex::BoundCond,_6UL>::operator[]
                           ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffff40,
                            (size_type)in_stack_ffffffffffffff38);
        BoundCond::operator=(pvVar8,0x67);
      }
      else {
        local_8 = "MLMGBndry::setBoxBC: Unknown LinOpBCType";
        Abort_host((char *)in_stack_ffffffffffffff50);
      }
    }
    else {
      in_stack_ffffffffffffff58 = local_28;
      Orientation::operator_cast_to_int(&local_50);
      pvVar8 = std::array<amrex::BoundCond,_6UL>::operator[]
                         ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffff40,
                          (size_type)in_stack_ffffffffffffff38);
      BoundCond::operator=(pvVar8,0x65);
      if (in_stack_00000010 < 1) {
        pRVar9 = RealVect::operator[](in_stack_00000018,i);
        pBVar10 = (Box *)*pRVar9;
      }
      else {
        pBVar10 = (Box *)((double)in_stack_00000010 * 0.5 *
                         *(double *)(in_stack_00000008 + (long)i * 8));
      }
      in_stack_ffffffffffffff40 = local_20;
      in_stack_ffffffffffffff50 = pBVar10;
      Orientation::operator_cast_to_int(&local_50);
      pvVar6 = std::array<double,_6UL>::operator[]
                         (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      *pvVar6 = (value_type_conflict1)pBVar10;
    }
    OrientationIter::operator++(local_4c);
  }
  return;
}

Assistant:

void
MLMGBndry::setBoxBC (RealTuple& bloc, BCTuple& bctag, const Box& bx, const Box& domain,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& lo,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& hi,
                     const Real* dx, int ratio,
                     const RealVect& interior_bloc,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi,
                     const GpuArray<int,AMREX_SPACEDIM>& is_periodic)
{
    for (OrientationIter fi; fi; ++fi)
    {
        const Orientation face = fi();
        const int         dir  = face.coordDir();

        if (domain[face] == bx[face] && !is_periodic[dir])
        {
            // All physical bc values are located on face.
            bloc[face] = face.isLow() ? domain_bloc_lo[dir] : domain_bloc_hi[dir];
            const auto linop_bc  = face.isLow() ? lo[dir] : hi[dir];
            if (linop_bc == LinOpBCType::Dirichlet) {
                bctag[face] = AMREX_LO_DIRICHLET;
            } else if (linop_bc == LinOpBCType::Neumann) {
                bctag[face] = AMREX_LO_NEUMANN;
            } else if (linop_bc == LinOpBCType::reflect_odd) {
                bctag[face] = AMREX_LO_REFLECT_ODD;
            } else {
                amrex::Abort("MLMGBndry::setBoxBC: Unknown LinOpBCType");
            }
        }
        else
        {
            // Internal bndry.
            bctag[face] = AMREX_LO_DIRICHLET;
            bloc[face]  = ratio > 0 ? Real(0.5)*ratio*dx[dir] : interior_bloc[dir];
            // If this is next to another same level box, bloc is
            // wrong.  But it doesn't matter, because we also have
            // mask.  It is used only if mask says it is next to
            // coarse cells.
        }
    }
}